

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

bool __thiscall
Lib::
FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
::hasNext(FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
          *this)

{
  ExtensionalityClause extCl;
  bool bVar1;
  long in_RDI;
  _ElementType next;
  Clause *in_stack_ffffffffffffff28;
  __doDeletion<true> *this_00;
  DelIterator *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff50;
  TermList in_stack_ffffffffffffff60;
  ExtensionalityClause local_90 [2];
  Clause *local_58;
  __doDeletion<true> *local_50;
  ActiveFilterFn *local_48;
  ExtensionalityClause local_40;
  ExtensionalityClause local_28;
  bool local_1;
  
  bVar1 = OptionBase<Saturation::ExtensionalityClause>::isSome
                    ((OptionBase<Saturation::ExtensionalityClause> *)(in_RDI + 0x20));
  if (bVar1) {
    local_1 = true;
  }
  else {
    while (bVar1 = List<Saturation::ExtensionalityClause>::DelIterator::hasNext
                             ((DelIterator *)in_stack_ffffffffffffff28), bVar1) {
      List<Saturation::ExtensionalityClause>::DelIterator::next(in_stack_ffffffffffffff40);
      move_if_value<Saturation::ExtensionalityClause,_true>(&local_28,&local_40);
      local_58 = local_28.clause;
      local_50 = (__doDeletion<true> *)local_28.literal;
      local_48 = (ActiveFilterFn *)local_28.sort._content;
      extCl.literal = (Literal *)in_RDI;
      extCl.clause = (Clause *)in_stack_ffffffffffffff50;
      extCl.sort._content = in_stack_ffffffffffffff60._content;
      in_stack_ffffffffffffff28 = local_28.clause;
      this_00 = (__doDeletion<true> *)local_28.literal;
      bVar1 = Saturation::ExtensionalityClauseContainer::ActiveFilterFn::operator()
                        ((ActiveFilterFn *)local_28.sort._content,extCl);
      if (bVar1) {
        move_if_value<Saturation::ExtensionalityClause,_true>(local_90,&local_28);
        Option<Saturation::ExtensionalityClause>::OptionBase
                  ((Option<Saturation::ExtensionalityClause> *)this_00,
                   (ExtensionalityClause *)in_stack_ffffffffffffff28);
        Option<Saturation::ExtensionalityClause>::operator=
                  ((Option<Saturation::ExtensionalityClause> *)this_00,
                   (Option<Saturation::ExtensionalityClause> *)in_stack_ffffffffffffff28);
        Option<Saturation::ExtensionalityClause>::~Option
                  ((Option<Saturation::ExtensionalityClause> *)0xac5c97);
        return true;
      }
      __doDeletion<true>::operator()(this_00,(DelIterator *)in_stack_ffffffffffffff28);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }